

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

BitMask<unsigned_int,_16,_0> __thiscall phmap::priv::GroupSse2Impl::MatchEmpty(GroupSse2Impl *this)

{
  BitMask<unsigned_int,_16,_0> BVar1;
  GroupSse2Impl *this_local;
  
  BVar1 = Match(this,0x80);
  return (BitMask<unsigned_int,_16,_0>)BVar1.mask_;
}

Assistant:

BitMask<uint32_t, kWidth> MatchEmpty() const {
#if PHMAP_HAVE_SSSE3
        // This only works because kEmpty is -128.
        return BitMask<uint32_t, kWidth>(
            static_cast<uint32_t>(_mm_movemask_epi8(_mm_sign_epi8(ctrl, ctrl))));
#else
        return Match(static_cast<h2_t>(kEmpty));
#endif
    }